

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-opt.h
# Opt level: O1

void __thiscall
mp::SolverOptionManager::AddStoredOption<int>
          (SolverOptionManager *this,char *name,char *description,int *value,ValueArrayRef values)

{
  tuple<mp::SolverOption_*,_std::default_delete<mp::SolverOption>_> this_00;
  ValueArrayRef values_00;
  __uniq_ptr_impl<mp::SolverOption,_std::default_delete<mp::SolverOption>_> local_40;
  SolverOptionManager *local_38;
  
  local_38 = this;
  this_00.super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>.
  super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>)
       operator_new(0xd8);
  values_00._8_8_ = values._8_8_ & 0xffffffff;
  values_00.values_ = values.values_;
  SolverOption::SolverOption
            ((SolverOption *)
             this_00.
             super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>.
             super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl,name,description,
             values_00,false);
  *(undefined ***)
   this_00.super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>.
   super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl = &PTR__SolverOption_0044ff98;
  ((SolverOption *)
  ((long)this_00.super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>.
         super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl + 0xd0))->_vptr_SolverOption
       = (_func_int **)value;
  local_40._M_t.super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>.
  super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl =
       (tuple<mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>)
       (tuple<mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>)
       this_00.super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>.
       super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl;
  AddOption(local_38,(OptionPtr *)&local_40);
  if ((_Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>)
      local_40._M_t.
      super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>.
      super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl != (SolverOption *)0x0) {
    (**(code **)(*(long *)local_40._M_t.
                          super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>
                          .super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl + 8))();
  }
  return;
}

Assistant:

void AddStoredOption(const char *name, const char *description,
                       Value& value, ValueArrayRef values = ValueArrayRef()) {
    AddOption(OptionPtr(
                new StoredOption<Value>(
                  name, description, value, values)));
  }